

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void utf8_suite::test_E0_80(void)

{
  view_type *pvVar1;
  undefined4 local_14c;
  value local_148 [2];
  undefined1 local_140 [8];
  decoder_type decoder;
  char input [5];
  
  decoder.current.scan._259_4_ = 0x2280e022;
  decoder.current.scan._263_1_ = 0;
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<5ul>
            ((basic_decoder<char> *)local_140,
             (value_type (*) [5])((long)&decoder.current.scan + 0x103));
  local_148[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_140);
  local_14c = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x7c0,"void utf8_suite::test_E0_80()",local_148,&local_14c);
  pvVar1 = trial::protocol::json::detail::basic_decoder<char>::literal
                     ((basic_decoder<char> *)local_140);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[4]>
            ("decoder.literal()","\"\\\"\\xE0\\x80\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x7c1,"void utf8_suite::test_E0_80()",pvVar1,anon_var_dwarf_6d06);
  return;
}

Assistant:

void test_E0_80()
{
    const char input[] = "\"\xE0\x80\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_unexpected_token);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "\"\xE0\x80");
}